

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

double __thiscall despot::DESPOT::CheckDESPOT(DESPOT *this,VNode *vnode,double regularized_value)

{
  History *history;
  pointer ppSVar1;
  DSPOMDP *pDVar2;
  undefined8 uVar3;
  int iVar4;
  ostream *poVar5;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar6;
  undefined4 extraout_var;
  VNode *this_00;
  clock_t cVar7;
  VNode *pVVar8;
  clock_t cVar9;
  clock_t cVar10;
  clock_t cVar11;
  int i;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double local_b8;
  double pruned_value;
  RandomStreams streams;
  ACT_TYPE pruned_action;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  pvVar6 = VNode::particles(vnode);
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar13 = 0;
      ppSVar1 = (pvVar6->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(pvVar6->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
      uVar13 = uVar13 + 1) {
    pDVar2 = (this->super_Solver).model_;
    iVar4 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar1[uVar13]);
    streams.streams_.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar4);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&copy,(State **)&streams);
  }
  this_00 = (VNode *)operator_new(0x98);
  VNode::VNode(this_00,&copy,0,(QNode *)0x0,0xffffffffffffffff);
  uVar3 = DAT_0019fde0;
  DAT_0019fde0 = 0;
  RandomStreams::RandomStreams(&streams,DAT_0019fdcc,DAT_0019fdd0);
  RandomStreams::position(&streams,0);
  history = &(this->super_Solver).history_;
  InitBounds(this_00,this->lower_bound_,this->upper_bound_,&streams,history);
  iVar4 = 0;
  local_b8 = 0.0;
  do {
    dVar14 = (double)iVar4;
    iVar12 = 1;
    do {
      cVar7 = clock();
      pVVar8 = Trial(this_00,&streams,this->lower_bound_,this->upper_bound_,
                     (this->super_Solver).model_,history,(SearchStatistics *)0x0);
      cVar9 = clock();
      cVar10 = clock();
      Backup(pVVar8);
      iVar4 = iVar4 + 1;
      cVar11 = clock();
      dVar15 = (double)iVar12;
      local_b8 = ((double)cVar11 - (double)cVar10) / 1000000.0 +
                 local_b8 + ((double)cVar9 - (double)cVar7) / 1000000.0;
      iVar12 = iVar12 + 1;
    } while (dVar15 <= dVar14 * 0.05);
    DAT_0019fde0 = uVar3;
    pVVar8 = Prune(this_00,&pruned_action,&pruned_value);
    DAT_0019fde0 = 0;
    VNode::Free(pVVar8,(this->super_Solver).model_);
    VNode::~VNode(pVVar8);
    operator_delete(pVVar8,0x98);
    poVar5 = std::operator<<((ostream *)&std::cout,"# trials = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::operator<<(poVar5,"; target = ");
    poVar5 = std::ostream::_M_insert<double>(regularized_value);
    std::operator<<(poVar5,", current = ");
    dVar14 = pruned_value;
    poVar5 = std::ostream::_M_insert<double>(pruned_value);
    std::operator<<(poVar5,", l = ");
    dVar15 = VNode::lower_bound(this_00);
    poVar5 = std::ostream::_M_insert<double>(dVar15);
    std::operator<<(poVar5,", u = ");
    dVar15 = VNode::upper_bound(this_00);
    poVar5 = std::ostream::_M_insert<double>(dVar15);
    std::operator<<(poVar5,"; time = ");
    poVar5 = std::ostream::_M_insert<double>(local_b8);
    std::endl<char,std::char_traits<char>>(poVar5);
  } while (dVar14 < regularized_value);
  poVar5 = std::operator<<((ostream *)&std::cout,"DESPOT: # trials = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::operator<<(poVar5,"; target = ");
  poVar5 = std::ostream::_M_insert<double>(regularized_value);
  std::operator<<(poVar5,", current = ");
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar5,", l = ");
  dVar14 = VNode::lower_bound(this_00);
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar5,", u = ");
  dVar14 = VNode::upper_bound(this_00);
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar5,"; time = ");
  poVar5 = std::ostream::_M_insert<double>(local_b8);
  std::endl<char,std::char_traits<char>>(poVar5);
  DAT_0019fde0 = uVar3;
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  VNode::Free(this_00,(this->super_Solver).model_);
  VNode::~VNode(this_00);
  operator_delete(this_00,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&streams.streams_);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return local_b8;
}

Assistant:

double DESPOT::CheckDESPOT(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i ++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	double pruning_constant = Globals::config.pruning_constant;
	Globals::config.pruning_constant = 0;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	streams.position(0);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0, prev_num = 0;
	double pruned_value;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		if (double(num_trials - prev_num) > 0.05 * prev_num) {
			ACT_TYPE pruned_action;
			Globals::config.pruning_constant = pruning_constant;
			VNode* pruned = Prune(root, pruned_action, pruned_value);
			Globals::config.pruning_constant = 0;
			prev_num = num_trials;

			pruned->Free(*model_);
			delete pruned;

			cout << "# trials = " << num_trials << "; target = "
				<< regularized_value << ", current = " << pruned_value
				<< ", l = " << root->lower_bound() << ", u = "
				<< root->upper_bound() << "; time = " << used_time << endl;

			if (pruned_value >= regularized_value) {
				break;
			}
		}
	} while (true);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << pruned_value << ", l = "
		<< root->lower_bound() << ", u = " << root->upper_bound() << "; time = "
		<< used_time << endl;
	Globals::config.pruning_constant = pruning_constant;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}